

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O3

int __thiscall basisu::huffman_encoding_table::init(huffman_encoding_table *this,EVP_PKEY_CTX *ctx)

{
  uint8_vec *this_00;
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  uint32_t i;
  ulong uVar4;
  sym_freq *A;
  ulong uVar5;
  uint in_ECX;
  uint uVar6;
  long lVar7;
  char *__function;
  int iVar8;
  uint uVar9;
  long in_RDX;
  uint32_t new_size;
  ulong uVar10;
  uint32_t j_1;
  uint uVar11;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> sym_freq0;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> sym_freq1;
  int num_codes [32];
  uint32_t next_code [32];
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> local_168;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint auStack_b8 [34];
  
  uVar9 = (uint)ctx;
  uVar5 = 0;
  uVar11 = 0;
  if (0xffffbfff < uVar9 - 0x4001 && in_ECX < 0x11) {
    uVar10 = (ulong)ctx & 0xffffffff;
    uVar4 = 0;
    do {
      uVar11 = ((int)uVar5 + 1) - (uint)(*(short *)(in_RDX + uVar4 * 2) == 0);
      uVar5 = (ulong)uVar11;
      uVar4 = uVar4 + 1;
    } while (uVar10 != uVar4);
    if (uVar11 == 0) {
      uVar11 = 0;
    }
    else {
      std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::vector
                (&local_168,uVar5,(allocator_type *)&local_138);
      std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::vector
                (&local_150,uVar5,(allocator_type *)&local_138);
      uVar4 = 0;
      uVar6 = 0;
      do {
        uVar3 = *(ushort *)(in_RDX + uVar4 * 2);
        if (uVar3 != 0) {
          local_168.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].m_key = (uint)uVar3;
          local_168.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].m_sym_index = (uint16_t)uVar4;
          uVar6 = uVar6 + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar10 != uVar4);
      A = canonical_huffman_radix_sort_syms
                    (uVar11,local_168.
                            super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                     local_150.
                     super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl
                     .super__Vector_impl_data._M_start);
      canonical_huffman_calculate_minimum_redundancy(A,uVar11);
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_138 = 0;
      uStack_130 = 0;
      uVar4 = 0;
      do {
        if (0x1f < (ulong)A[uVar4].m_key) {
          uVar11 = 0;
          goto LAB_0021f860;
        }
        piVar1 = (int *)((long)&local_138 + (ulong)A[uVar4].m_key * 4);
        *piVar1 = *piVar1 + 1;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      canonical_huffman_enforce_max_code_size((int *)&local_138,uVar11,in_ECX);
      if ((this->m_code_sizes).m_size != 0) {
        (this->m_code_sizes).m_size = 0;
      }
      this_00 = &this->m_code_sizes;
      uVar11 = 0;
      if ((this->m_code_sizes).m_capacity < uVar9) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar9,uVar9 == 1,1,(object_mover)0x0,false);
        uVar11 = (this->m_code_sizes).m_size;
      }
      memset((this->m_code_sizes).m_p + uVar11,0,(ulong)(uVar9 - uVar11));
      (this->m_code_sizes).m_size = uVar9;
      if ((this->m_codes).m_size != 0) {
        (this->m_codes).m_size = 0;
      }
      uVar11 = 0;
      if ((this->m_codes).m_capacity < uVar9) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,uVar9,uVar9 == 1,2,(object_mover)0x0,false);
        uVar11 = (this->m_codes).m_size;
      }
      memset((this->m_codes).m_p + uVar11,0,(ulong)(uVar9 - uVar11) * 2);
      (this->m_codes).m_size = uVar9;
      if (in_ECX == 0) {
        auStack_b8[1] = 0;
      }
      else {
        uVar4 = 1;
        do {
          for (iVar8 = *(int *)((long)&local_138 + uVar4 * 4); iVar8 != 0; iVar8 = iVar8 + -1) {
            uVar5 = (ulong)((int)uVar5 - 1);
            if ((this->m_code_sizes).m_size <= (uint)A[uVar5].m_sym_index) goto LAB_0021f8a7;
            this_00->m_p[A[uVar5].m_sym_index] = (uchar)uVar4;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != in_ECX + 1);
        auStack_b8[1] = 0;
        if (in_ECX != 1) {
          lVar7 = 0;
          uVar9 = 0;
          do {
            uVar9 = (uVar9 + *(int *)((long)&local_138 + lVar7 * 4 + 4)) * 2;
            auStack_b8[lVar7 + 2] = uVar9;
            lVar7 = lVar7 + 1;
          } while ((ulong)in_ECX - 1 != lVar7);
        }
      }
      auStack_b8[1] = 0;
      uVar5 = 0;
      uVar9 = 0;
      do {
        uVar11 = uVar9;
        if ((this->m_code_sizes).m_size <= uVar5) {
LAB_0021f8a7:
          __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
LAB_0021f8bc:
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x178,__function);
        }
        bVar2 = this_00->m_p[uVar5];
        uVar9 = (uint)bVar2;
        if (bVar2 != 0) {
          if (0x1f < bVar2) break;
          uVar11 = auStack_b8[bVar2];
          auStack_b8[bVar2] = uVar11 + 1;
          iVar8 = 0;
          do {
            iVar8 = (uVar11 & 1) + iVar8 * 2;
            uVar11 = uVar11 >> 1;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          if ((this->m_codes).m_size <= uVar5) {
            __function = 
            "T &basisu::vector<unsigned short>::operator[](size_t) [T = unsigned short]";
            goto LAB_0021f8bc;
          }
          (this->m_codes).m_p[uVar5] = (unsigned_short)iVar8;
        }
        uVar5 = uVar5 + 1;
        uVar11 = (uint)(uVar10 <= uVar5);
        uVar9 = (uint)(uVar10 <= uVar5);
      } while (uVar5 != uVar10);
LAB_0021f860:
      if (local_150.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl.
          super__Vector_impl_data._M_start != (sym_freq *)0x0) {
        operator_delete(local_150.
                        super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_168.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl.
          super__Vector_impl_data._M_start != (sym_freq *)0x0) {
        operator_delete(local_168.
                        super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return uVar11;
}

Assistant:

bool huffman_encoding_table::init(uint32_t num_syms, const uint16_t *pFreq, uint32_t max_code_size)
	{
		if (max_code_size > cHuffmanMaxSupportedCodeSize)
			return false;
		if ((!num_syms) || (num_syms > cHuffmanMaxSyms))
			return false;

		uint32_t total_used_syms = 0;
		for (uint32_t i = 0; i < num_syms; i++)
			if (pFreq[i])
				total_used_syms++;

		if (!total_used_syms)
			return false;

		std::vector<sym_freq> sym_freq0(total_used_syms), sym_freq1(total_used_syms);
		for (uint32_t i = 0, j = 0; i < num_syms; i++)
		{
			if (pFreq[i])
			{
				sym_freq0[j].m_key = pFreq[i];
				sym_freq0[j++].m_sym_index = static_cast<uint16_t>(i);
			}
		}

		sym_freq *pSym_freq = canonical_huffman_radix_sort_syms(total_used_syms, &sym_freq0[0], &sym_freq1[0]);

		canonical_huffman_calculate_minimum_redundancy(pSym_freq, total_used_syms);

		int num_codes[cHuffmanMaxSupportedInternalCodeSize + 1];
		clear_obj(num_codes);

		for (uint32_t i = 0; i < total_used_syms; i++)
		{
			if (pSym_freq[i].m_key > cHuffmanMaxSupportedInternalCodeSize)
				return false;

			num_codes[pSym_freq[i].m_key]++;
		}

		canonical_huffman_enforce_max_code_size(num_codes, total_used_syms, max_code_size);

		m_code_sizes.resize(0);
		m_code_sizes.resize(num_syms);

		m_codes.resize(0);
		m_codes.resize(num_syms);

		for (uint32_t i = 1, j = total_used_syms; i <= max_code_size; i++)
			for (uint32_t l = num_codes[i]; l > 0; l--)
				m_code_sizes[pSym_freq[--j].m_sym_index] = static_cast<uint8_t>(i);

		uint32_t next_code[cHuffmanMaxSupportedInternalCodeSize + 1];

		next_code[1] = 0;
		for (uint32_t j = 0, i = 2; i <= max_code_size; i++)
			next_code[i] = j = ((j + num_codes[i - 1]) << 1);

		for (uint32_t i = 0; i < num_syms; i++)
		{
			uint32_t rev_code = 0, code, code_size;
			if ((code_size = m_code_sizes[i]) == 0)
				continue;
			if (code_size > cHuffmanMaxSupportedInternalCodeSize)
				return false;
			code = next_code[code_size]++;
			for (uint32_t l = code_size; l > 0; l--, code >>= 1)
				rev_code = (rev_code << 1) | (code & 1);
			m_codes[i] = static_cast<uint16_t>(rev_code);
		}

		return true;
	}